

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::outsubfaces(tetgenmesh *this,tetgenio *out)

{
  int iVar1;
  memorypool *pmVar2;
  tetgenbehavior *ptVar3;
  void **ppvVar4;
  bool bVar5;
  FILE *pFVar6;
  size_t sVar7;
  int *piVar8;
  void *pvVar9;
  ulong uVar10;
  undefined4 *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  point pp [3];
  char facefilename [1024];
  uint local_48c;
  uint local_488;
  uint local_484;
  int local_478;
  int local_474;
  int local_470;
  int local_46c;
  long local_468 [3];
  FILE *local_450;
  int *local_448;
  int *local_440;
  char local_438 [4];
  undefined2 auStack_434 [514];
  
  local_468[0] = 0;
  local_468[1] = 0;
  local_468[2] = 0;
  if (out == (tetgenio *)0x0) {
    strcpy(local_438,this->b->outfilename);
    sVar7 = strlen(local_438);
    builtin_strncpy(local_438 + sVar7,".fac",4);
    *(undefined2 *)((long)auStack_434 + sVar7) = 0x65;
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",local_438);
    }
    else {
      puts("Writing faces.");
    }
  }
  if (out == (tetgenio *)0x0) {
    local_450 = fopen(local_438,"w");
    if (local_450 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",local_438);
      puVar11 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar11 = 3;
      __cxa_throw(puVar11,&int::typeinfo,0);
    }
    local_448 = (int *)0x0;
    fprintf(local_450,"%ld  %d\n",this->subfaces->items,(ulong)(this->b->nobound == 0));
    local_440 = (int *)0x0;
  }
  else {
    pmVar2 = this->subfaces;
    local_440 = (int *)operator_new__(-(ulong)((ulong)(pmVar2->items * 3) >> 0x3e != 0) |
                                      pmVar2->items * 0xc);
    out->trifacelist = local_440;
    ptVar3 = this->b;
    if (ptVar3->order == 2) {
      uVar10 = 0xffffffffffffffff;
      if ((ulong)(pmVar2->items * 3) < 0x4000000000000000) {
        uVar10 = pmVar2->items * 0xc;
      }
      piVar8 = (int *)operator_new__(uVar10);
      out->o2facelist = piVar8;
    }
    if (ptVar3->nobound == 0) {
      uVar10 = 0xffffffffffffffff;
      if ((ulong)pmVar2->items < 0x4000000000000000) {
        uVar10 = pmVar2->items * 4;
      }
      piVar8 = (int *)operator_new__(uVar10);
      out->trifacemarkerlist = piVar8;
    }
    if (1 < ptVar3->neighout) {
      piVar8 = (int *)operator_new__(-(ulong)((pmVar2->items & 0x6000000000000000U) != 0) |
                                     pmVar2->items << 3);
      out->face2tetlist = piVar8;
    }
    out->numberoftrifaces = (int)pmVar2->items;
    local_448 = out->trifacemarkerlist;
    local_450 = (FILE *)0x0;
  }
  uVar15 = 0;
  if (this->b->zeroindex == 0) {
    uVar15 = this->in->firstnumber;
  }
  pmVar2 = this->subfaces;
  iVar1 = this->in->firstnumber;
  bVar5 = uVar15 == 0;
  ppvVar4 = pmVar2->firstblock;
  pmVar2->pathblock = ppvVar4;
  pmVar2->pathitem =
       (void *)((long)ppvVar4 +
               (((long)pmVar2->alignbytes + 8U) -
               (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar2->alignbytes));
  pmVar2->pathitemsleft = pmVar2->itemsperblock;
  do {
    pvVar9 = memorypool::traverse(pmVar2);
    if (pvVar9 == (void *)0x0) {
      pvVar9 = (void *)0x0;
      break;
    }
  } while (*(long *)((long)pvVar9 + 0x18) == 0);
  if (pvVar9 != (void *)0x0) {
    local_474 = 0;
    local_488 = 0;
    local_48c = 0;
    local_484 = 0;
    local_470 = 0;
    local_478 = 0;
    local_46c = 0;
    do {
      pFVar6 = local_450;
      uVar10 = (ulong)((uint)*(ulong *)((long)pvVar9 + 0x48) & 0xf);
      uVar18 = *(ulong *)((long)pvVar9 + 0x48) & 0xfffffffffffffff0;
      if (uVar18 != 0) {
        uVar20 = stpivottbl[uVar10][0];
        uVar10 = (ulong)uVar20;
        if (*(point *)(uVar18 + 0x38) == this->dummypoint) {
          uVar10 = *(ulong *)(uVar18 + (ulong)(uVar20 & 3) * 8);
          uVar18 = uVar10 & 0xfffffffffffffff0;
          uVar10 = (ulong)(uint)fsymtbl[(int)uVar20][(uint)uVar10 & 0xf];
        }
      }
      if (uVar18 == 0) {
        lVar14 = *(long *)((long)pvVar9 + (long)sorgpivot[0] * 8);
        lVar16 = *(long *)((long)pvVar9 + (long)sdestpivot[0] * 8);
        lVar13 = *(long *)((long)pvVar9 + (long)sapexpivot[0] * 8);
        if (this->b->order == 2) {
          local_468[0] = lVar14;
          local_468[1] = lVar16;
          local_468[2] = lVar13;
        }
      }
      else {
        iVar17 = (int)uVar10;
        lVar14 = *(long *)(uVar18 + (long)orgpivot[iVar17] * 8);
        lVar16 = *(long *)(uVar18 + (long)destpivot[iVar17] * 8);
        lVar13 = *(long *)(uVar18 + (long)apexpivot[iVar17] * 8);
        if (this->b->order == 2) {
          lVar12 = *(long *)(uVar18 + 0x58);
          lVar19 = 0;
          do {
            local_468[lVar19] = *(long *)(lVar12 + (long)ver2edge[(int)uVar10] * 8);
            uVar10 = (ulong)(uint)enexttbl[(int)uVar10];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
        }
      }
      ptVar3 = this->b;
      if (ptVar3->nobound == 0) {
        local_484 = *(uint *)((long)pvVar9 + (long)this->shmarkindex * 4);
      }
      if (1 < ptVar3->neighout) {
        uVar10 = *(ulong *)((long)pvVar9 + 0x48) & 0xfffffffffffffff0;
        if (uVar10 == 0) {
          local_48c = 0xffffffff;
          local_488 = 0xffffffff;
        }
        else {
          local_488 = 0xffffffff;
          local_48c = 0xffffffff;
          if (*(point *)(uVar10 + 0x38) != this->dummypoint) {
            local_48c = *(uint *)(uVar10 + 0x50);
          }
          uVar10 = *(ulong *)(uVar10 + (ulong)(stpivottbl
                                               [(uint)*(ulong *)((long)pvVar9 + 0x48) & 0xf][0] & 3)
                                       * 8) & 0xfffffffffffffff0;
          if (*(point *)(uVar10 + 0x38) != this->dummypoint) {
            local_488 = *(uint *)(uVar10 + 0x50);
          }
        }
      }
      uVar20 = (uint)(iVar1 == 1 && bVar5);
      if (out == (tetgenio *)0x0) {
        lVar12 = (long)this->pointmarkindex;
        fprintf(local_450,"%5d   %4d  %4d  %4d",(ulong)uVar15,
                (ulong)(*(int *)(lVar14 + lVar12 * 4) - uVar20),
                (ulong)(*(int *)(lVar16 + lVar12 * 4) - uVar20),
                (ulong)(*(int *)(lVar13 + lVar12 * 4) - uVar20));
        if (this->b->order == 2) {
          lVar14 = (long)this->pointmarkindex;
          fprintf(pFVar6,"  %4d  %4d  %4d",(ulong)(*(int *)(local_468[0] + lVar14 * 4) - uVar20),
                  (ulong)(*(int *)(local_468[1] + lVar14 * 4) - uVar20),
                  (ulong)(*(int *)(local_468[2] + lVar14 * 4) - uVar20));
        }
        if (this->b->nobound == 0) {
          fprintf(pFVar6,"    %d",(ulong)local_484);
        }
        if (1 < this->b->neighout) {
          fprintf(pFVar6,"    %5d  %5d",(ulong)local_48c,(ulong)local_488);
        }
        fputc(10,pFVar6);
      }
      else {
        lVar12 = (long)local_46c;
        local_440[lVar12] = *(int *)(lVar14 + (long)this->pointmarkindex * 4) - uVar20;
        local_440[lVar12 + 1] = *(int *)(lVar16 + (long)this->pointmarkindex * 4) - uVar20;
        local_440[lVar12 + 2] = *(int *)(lVar13 + (long)this->pointmarkindex * 4) - uVar20;
        if (ptVar3->order == 2) {
          piVar8 = out->o2facelist;
          lVar14 = (long)local_474;
          piVar8[lVar14] = *(int *)(local_468[0] + (long)this->pointmarkindex * 4) - uVar20;
          piVar8[lVar14 + 1] = *(int *)(local_468[1] + (long)this->pointmarkindex * 4) - uVar20;
          local_474 = local_474 + 3;
          piVar8[lVar14 + 2] = *(int *)(local_468[2] + (long)this->pointmarkindex * 4) - uVar20;
        }
        if (ptVar3->nobound == 0) {
          lVar14 = (long)local_478;
          local_478 = local_478 + 1;
          local_448[lVar14] = local_484;
        }
        local_46c = local_46c + 3;
        if (1 < ptVar3->neighout) {
          piVar8 = out->face2tetlist;
          lVar14 = (long)local_470;
          piVar8[lVar14] = local_48c;
          local_470 = local_470 + 2;
          piVar8[lVar14 + 1] = local_488;
        }
      }
      uVar15 = uVar15 + 1;
      pmVar2 = this->subfaces;
      do {
        pvVar9 = memorypool::traverse(pmVar2);
        if (pvVar9 == (void *)0x0) {
          pvVar9 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar9 + 0x18) == 0);
    } while (pvVar9 != (void *)0x0);
  }
  pFVar6 = local_450;
  if (out == (tetgenio *)0x0) {
    fprintf(local_450,"# Generated by %s\n",this->b->commandline);
    fclose(pFVar6);
  }
  return;
}

Assistant:

void tetgenmesh::outsubfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  int *elist = NULL;
  int *emlist = NULL;
  int index = 0, index1 = 0, index2 = 0;
  triface abuttingtet;
  face faceloop;
  point torg, tdest, tapex;
  int marker = 0;
  int firstindex, shift;
  int neigh1 = 0, neigh2 = 0;
  int facenumber;

  // For -o2 option.
  triface workface;
  point *extralist, pp[3] = {0,0,0}; 
  int highorderindex = 11;
  int o2index = 0, i;

  int t1ver; // used by fsymself()

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 3);
    }
    // Number of subfaces.
    fprintf(outfile, "%ld  %d\n", subfaces->items, !b->nobound);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[subfaces->items * 3];
    if (out->trifacelist == (int *) NULL) {
      terminatetetgen(this, 1);
    }
    if (b->order == 2) {
      out->o2facelist = new int[subfaces->items * 3];
    }
    if (!b->nobound) {
      // Allocate memory for 'trifacemarkerlist'.
      out->trifacemarkerlist = new int[subfaces->items];
      if (out->trifacemarkerlist == (int *) NULL) {
        terminatetetgen(this, 1);
      }
    }
    if (b->neighout > 1) {
      // '-nn' switch.
      out->face2tetlist = new int[subfaces->items * 2];
      if (out->face2tetlist == (int *) NULL) {
        terminatetetgen(this, 1);
      }
    }
    out->numberoftrifaces = subfaces->items;
    elist = out->trifacelist;
    emlist = out->trifacemarkerlist;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  subfaces->traversalinit();
  faceloop.sh = shellfacetraverse(subfaces);
  facenumber = firstindex; // in->firstnumber;
  while (faceloop.sh != (shellface *) NULL) {
    stpivot(faceloop, abuttingtet);
    // If there is a tetrahedron containing this subface, orient it so
    //   that the normal of this face points to inside of the volume by
    //   right-hand rule.
    if (abuttingtet.tet != NULL) {
      if (ishulltet(abuttingtet)) {
        fsymself(abuttingtet);
      }
    }
    if (abuttingtet.tet != NULL) {
      torg = org(abuttingtet);
      tdest = dest(abuttingtet);
      tapex = apex(abuttingtet);
      if (b->order == 2) { // -o2
        // Get the three extra vertices on edges.
        extralist = (point *) (abuttingtet.tet[highorderindex]);
        workface = abuttingtet;
        for (i = 0; i < 3; i++) {
          pp[i] = extralist[ver2edge[workface.ver]];
          enextself(workface);
        }
      }
    } else {
      // This may happen when only a surface mesh be generated.
      torg = sorg(faceloop);
      tdest = sdest(faceloop);
      tapex = sapex(faceloop);
      if (b->order == 2) { // -o2
        // There is no extra node list available.
        pp[0] = torg;
        pp[1] = tdest;
        pp[2] = tapex;
      }
    }
    if (!b->nobound) {
      marker = shellmark(faceloop);
    }
    if (b->neighout > 1) {
      // '-nn' switch. Output adjacent tets indices.
      neigh1 = -1;
      neigh2 = -1;
      stpivot(faceloop, abuttingtet);
      if (abuttingtet.tet != NULL) {
        if (!ishulltet(abuttingtet)) {
          neigh1 = elemindex(abuttingtet.tet);
        }
        fsymself(abuttingtet);
        if (!ishulltet(abuttingtet)) {
          neigh2 = elemindex(abuttingtet.tet);
        }
      }
    }
    if (out == (tetgenio *) NULL) {
      fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
              pointmark(torg) - shift, pointmark(tdest) - shift,
              pointmark(tapex) - shift);
      if (b->order == 2) { // -o2
        fprintf(outfile, "  %4d  %4d  %4d", pointmark(pp[0]) - shift, 
                pointmark(pp[1]) - shift, pointmark(pp[2]) - shift);
      }
      if (!b->nobound) {
        fprintf(outfile, "    %d", marker);
      }
      if (b->neighout > 1) {
        fprintf(outfile, "    %5d  %5d", neigh1, neigh2);
      }
      fprintf(outfile, "\n");
    } else {
      // Output three vertices of this face;
      elist[index++] = pointmark(torg) - shift;
      elist[index++] = pointmark(tdest) - shift;
      elist[index++] = pointmark(tapex) - shift;
      if (b->order == 2) { // -o2
        out->o2facelist[o2index++] = pointmark(pp[0]) - shift;
        out->o2facelist[o2index++] = pointmark(pp[1]) - shift;
        out->o2facelist[o2index++] = pointmark(pp[2]) - shift;
      }
      if (!b->nobound) {
        emlist[index1++] = marker;
      }
      if (b->neighout > 1) {
        out->face2tetlist[index2++] = neigh1;
        out->face2tetlist[index2++] = neigh2;
      }
    }
    facenumber++;
    faceloop.sh = shellfacetraverse(subfaces);
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}